

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O0

Debug * __thiscall
Corrade::Utility::Debug::print<Corrade::Containers::BasicStringView<char_const>>
          (Debug *this,BasicStringView<const_char> *value)

{
  bool bVar1;
  ostream *poVar2;
  EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)__xff_> local_72;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_71;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_70;
  UnderlyingType local_6f;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_6e;
  EnumSet local_6d;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_6c;
  UnderlyingType local_6b;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_6a;
  EnumSet local_69;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_68;
  UnderlyingType local_67;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_66;
  EnumSet local_65 [20];
  Flags local_51;
  Error local_50;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_22;
  EnumSet local_21;
  BasicStringView<const_char> *local_20;
  BasicStringView<const_char> *value_local;
  Debug *this_local;
  
  if (this->_output != (ostream *)0x0) {
    local_20 = value;
    value_local = (BasicStringView<const_char> *)this;
    if (this->_sourceLocationFile != (char *)0x0) {
      Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
                (&local_22,NoSpace);
      local_21 = (EnumSet)Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>
                          ::operator&(&this->_immediateFlags,local_22);
      bVar1 = Containers::EnumSet::operator_cast_to_bool(&local_21);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        poVar2 = Error::defaultOutput();
        Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
                  (&local_51);
        Error::Error(&local_50,poVar2,local_51);
        operator<<(&local_50.super_Debug,
                   "Assertion _immediateFlags & Flag::NoSpace failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Debug.cpp:700"
                  );
        Error::~Error(&local_50);
        abort();
      }
      poVar2 = std::operator<<(this->_output,this->_sourceLocationFile);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_sourceLocationLine);
      std::operator<<(poVar2,": ");
      this->_sourceLocationFile = (char *)0x0;
    }
    local_67 = (this->_flags)._value;
    local_66 = Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::operator|
                         (&this->_immediateFlags,local_67);
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
              (&local_68,NoSpace);
    local_65[0] = (EnumSet)Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>
                           ::operator&(&local_66,local_68);
    bVar1 = Containers::EnumSet::operator_cast_to_bool(local_65);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::operator<<(this->_output,' ');
    }
    local_6b = (this->_flags)._value;
    local_6a = Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::operator|
                         (&this->_immediateFlags,local_6b);
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
              (&local_6c,Hex);
    local_69 = (EnumSet)Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::
                        operator&(&local_6a,local_6c);
    Containers::EnumSet::operator_cast_to_bool(&local_69);
    (anonymous_namespace)::toStream<Corrade::Containers::BasicStringView<char_const>>
              (this->_output,local_20);
    local_6f = (this->_flags)._value;
    local_6e = Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::operator|
                         (&this->_immediateFlags,local_6f);
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
              (&local_70,Hex);
    local_6d = (EnumSet)Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::
                        operator&(&local_6e,local_70);
    Containers::EnumSet::operator_cast_to_bool(&local_6d);
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_71);
    (this->_immediateFlags)._value = local_71._value;
    Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::EnumSet
              (&local_72,ValueWritten);
    Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::operator|=
              (&this->_internalFlags,local_72);
  }
  return this;
}

Assistant:

Debug& Debug::print(const T& value) {
    if(!_output) return *this;

    #ifdef CORRADE_SOURCE_LOCATION_BUILTINS_SUPPORTED
    /* Print source location, if not printed yet */
    if(_sourceLocationFile) {
        CORRADE_INTERNAL_ASSERT(_immediateFlags & Flag::NoSpace);
        *_output << _sourceLocationFile << ":" << _sourceLocationLine << ": ";
        _sourceLocationFile = nullptr;
    }
    #endif

    /* Separate values with spaces if enabled */
    if(!((_immediateFlags|_flags) & Flag::NoSpace))
        *_output << ' ';
    /* Print the next value as hexadecimal if enabled */
    /** @todo this does strange crap for negative values (printing them as
        unsigned), revisit once iostreams are not used anymore */
    if(((_immediateFlags|_flags) & Flag::Hex) && std::is_integral<T>::value)
        *_output << "0x" << std::hex;

    toStream(*_output, value);

    /* Reset the hexadecimal printing back if it was enabled */
    if(((_immediateFlags|_flags) & Flag::Hex) && std::is_integral<T>::value)
        *_output << std::dec;

    /* Reset all immediate flags after */
    _immediateFlags = {};

    _internalFlags |= InternalFlag::ValueWritten;
    return *this;
}